

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
CService::GetKey(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
                CService *this)

{
  long in_FS_OFFSET;
  uchar local_1a;
  uchar local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::GetAddrBytes(__return_storage_ptr__,&this->super_CNetAddr);
  local_19 = *(uchar *)((long)&this->port + 1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (__return_storage_ptr__,&local_19);
  local_1a = (uchar)this->port;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (__return_storage_ptr__,&local_1a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> CService::GetKey() const
{
    auto key = GetAddrBytes();
    key.push_back(port / 0x100); // most significant byte of our port
    key.push_back(port & 0x0FF); // least significant byte of our port
    return key;
}